

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O3

bool pd::readWordsVec(string *dict_filename,
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                     *words_dict)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  pointer pbVar4;
  pointer pcVar5;
  _Alloc_hider _Var6;
  char cVar7;
  int iVar8;
  ostream *poVar9;
  int *piVar10;
  ulonglong uVar11;
  istream *piVar12;
  undefined8 uVar13;
  undefined1 auVar14 [8];
  ulong uVar15;
  undefined1 auStack_470 [8];
  istringstream is;
  ios_base local_3f8 [264];
  long local_2f0;
  ifstream fi;
  uint auStack_2d0 [122];
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_e8;
  ulong local_e0;
  undefined1 auStack_d8 [8];
  string word;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coords;
  vector<double,_std::allocator<double>_> items_1;
  undefined1 local_78 [8];
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  double local_38;
  double x;
  
  std::ifstream::ifstream(&local_2f0,(string *)dict_filename,_S_in);
  uVar1 = *(uint *)((long)auStack_2d0 + *(long *)(local_2f0 + -0x18));
  if ((uVar1 & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dict_filename->_M_dataplus)._M_p,
                        dict_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," doesn\'t exist",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    goto LAB_0010dc5f;
  }
  local_78 = (undefined1  [8])&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  local_e8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)words_dict;
  cVar7 = std::ios::widen((char)*(long *)(local_2f0 + -0x18) + (char)&stack0xfffffffffffffff8 +
                          '\x18');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_2f0,(string *)local_78,cVar7);
  line.field_2._8_8_ = 0;
  ex::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_d8,(string *)local_78,' ');
  auStack_470 = (undefined1  [8])line.field_2._8_8_;
  _Var6 = word._M_dataplus;
  line.field_2._8_8_ = auStack_d8;
  _is = (pointer)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  word._M_dataplus._M_p = (pointer)0x0;
  word._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_470);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_d8);
  if ((long)_Var6._M_p - line.field_2._8_8_ != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dict_filename->_M_dataplus)._M_p,
                        dict_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," has incorrect format (wrong first line)",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  pbVar4 = *(pointer *)(line.field_2._8_8_ + 0x20);
  piVar10 = __errno_location();
  iVar2 = *piVar10;
  *piVar10 = 0;
  uVar11 = strtoull((char *)pbVar4,(char **)auStack_470,10);
  iVar8 = (int)uVar11;
  if (auStack_470 == (undefined1  [8])pbVar4) {
    uVar13 = std::__throw_invalid_argument("stoull");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&line.field_2 + 8));
    if (local_78 != (undefined1  [8])&line._M_string_length) {
      operator_delete((void *)local_78);
    }
    std::ifstream::~ifstream(&local_2f0);
    _Unwind_Resume(uVar13);
  }
  if (*piVar10 == 0) {
LAB_0010d98c:
    *piVar10 = iVar2;
  }
  else if (*piVar10 == 0x22) {
    iVar8 = std::__throw_out_of_range("stoull");
    goto LAB_0010d98c;
  }
  uVar15 = (ulong)(iVar8 + 1);
  local_e0 = uVar15;
  while( true ) {
    cVar7 = std::ios::widen((char)*(undefined8 *)(local_2f0 + -0x18) + (char)(istream *)&local_2f0);
    piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_2f0,(string *)local_78,cVar7);
    if ((((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) ||
       (line._M_dataplus._M_p == (pointer)0x0)) break;
    ex::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0,(string *)local_78,' ');
    if ((long)coords.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)local_b0 >> 5 == uVar15) {
      auStack_d8 = (undefined1  [8])&word._M_string_length;
      pcVar5 = ((_Alloc_hider *)local_b0)->_M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_d8,pcVar5,pcVar5 + *(size_type *)((long)local_b0 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0,(iterator)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_b0 + 0x20));
      pbVar4 = coords.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      coords.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      for (auVar14 = local_b0; auVar14 != (undefined1  [8])pbVar4;
          auVar14 = (undefined1  [8])((long)auVar14 + 0x20)) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)auStack_470,(string *)auVar14,_S_in);
        local_38 = 0.0;
        piVar12 = std::istream::_M_extract<double>((double *)auStack_470);
        uVar3 = *(uint *)(piVar12 + *(long *)(*(long *)piVar12 + -0x18) + 0x20);
        if ((uVar3 & 5) == 0) {
          if (items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)
                       &coords.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(iterator)0x0,&local_38);
          }
          else {
            *items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = local_38;
            items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Line ",5);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_78,(long)line._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," has incorrect numbers",0x16);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)auStack_470);
        std::ios_base::~ios_base(local_3f8);
        if ((uVar3 & 5) != 0) break;
      }
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,std::vector<double,std::allocator<double>>&>
                (local_e8,auStack_d8,
                 &coords.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar15 = local_e0;
      if (coords.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(coords.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (auStack_d8 != (undefined1  [8])&word._M_string_length) {
        operator_delete((void *)auStack_d8);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Incorrect line ",0xf);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_78,(long)line._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&line.field_2 + 8));
  if (local_78 != (undefined1  [8])&line._M_string_length) {
    operator_delete((void *)local_78);
  }
LAB_0010dc5f:
  std::ifstream::~ifstream(&local_2f0);
  return (uVar1 & 5) == 0;
}

Assistant:

bool readWordsVec(const std::string& dict_filename, std::unordered_map<std::string, std::vector<double>>& words_dict)
    {
        std::ifstream fi(dict_filename);
        if (not fi)
        {
            std::cerr << "File " << dict_filename << " doesn't exist" << std::endl;
            return false;
        }

        std::string line;
        
        //read first line and get number of features
        std::getline(fi, line);
        std::vector<std::string> items;
        items = ex::split(line, ' ');
        if (items.size() != 2)
            std::cerr << "File " << dict_filename << " has incorrect format (wrong first line)" << std::endl;
        
        uint32_t num_features = 0;
        try
        {
            num_features = std::stoull(items[1]);
        }
        catch (std::invalid_argument& exc)
        {
            std::cerr << "Incorrect first line of file " << dict_filename << std::endl;
        }
        
        while (std::getline(fi, line) and !line.empty())
        {
            std::vector<std::string> coords = ex::split(line, ' ');
            if (coords.size() != num_features + 1)
            {
                std::cerr << "Incorrect line " << line << std::endl; 
                continue;
            }
            
            std::string word = coords[0];
            coords.erase(coords.begin(), coords.begin() + 1);
            std::vector<double> items; 
            for (const std::string& s: coords)
            {
                std::istringstream is(s);
                double x = 0;
                if (!(is >> x))
                {
                    std::cerr << "Line " << line << " has incorrect numbers" << std::endl;
                    break;
                }
                items.push_back(x);
            }                     
            words_dict.emplace(word, items);
        }        
        return true;
    }